

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execBitDxEa<(moira::Instr)32,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  bool bVar2;
  u32 uVar3;
  undefined8 in_RAX;
  u32 data;
  u32 ea;
  undefined8 local_18;
  
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  local_18 = in_RAX;
  bVar2 = readOp<(moira::Mode)3,(moira::Size)1,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_18 + 4),(u32 *)&local_18);
  if (bVar2) {
    (this->reg).sr.z = ((uint)local_18 >> (uVar1 & 7) & 1) == 0;
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    local_18._0_4_ = (uint)local_18 | 1 << ((byte)uVar1 & 7);
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_18._4_4_,(uint)local_18);
  }
  return;
}

Assistant:

void
Moira::execBitDxEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    switch (M) {

        case 0:
        {
            u8 b = readD(src) & 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, b);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(b));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            u8 b = readD(src) & 0b111;

            u32 ea, data;
            if (!readOp<M, Byte>(dst, ea, data)) return;

            data = bit<I>(data, b);

            if (I != BTST) {
                prefetch();
                writeM<M, Byte, POLLIPL>(ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}